

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int check_policy(X509_STORE_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  uint in_R8D;
  X509 *current_cert;
  X509 *local_10;
  
  local_10 = (X509 *)0x0;
  iVar1 = X509_policy_check((X509_POLICY_TREE **)ctx->chain,(int *)ctx->param->policies,
                            (stack_st_X509 *)ctx->param->flags,(stack_st_ASN1_OBJECT *)&local_10,
                            in_R8D);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    ctx->current_cert = local_10;
    ctx->error = iVar1;
    uVar2 = 0;
    if (iVar1 != 0x11) {
      uVar2 = (*ctx->verify_cb)(0,ctx);
      if (1 < uVar2) {
        abort();
      }
    }
  }
  return uVar2;
}

Assistant:

static int check_policy(X509_STORE_CTX *ctx) {
  X509 *current_cert = NULL;
  int ret = X509_policy_check(ctx->chain, ctx->param->policies,
                              ctx->param->flags, &current_cert);
  if (ret != X509_V_OK) {
    ctx->current_cert = current_cert;
    ctx->error = ret;
    if (ret == X509_V_ERR_OUT_OF_MEM) {
      return 0;
    }
    return call_verify_cb(0, ctx);
  }

  return 1;
}